

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

void __thiscall
cmCTestLaunch::DumpFileToXML(cmCTestLaunch *this,cmXMLElement *e3,char *tag,string *fname)

{
  bool bVar1;
  cmCTestLaunch *this_00;
  cmXMLElement e4;
  char *sep;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *local_280;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream fin;
  
  std::ifstream::ifstream(&fin,(fname->_M_dataplus)._M_p,_S_in|_S_bin);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  sep = "";
  cmXMLElement::cmXMLElement(&e4,e3,tag);
  local_280 = &this->RegexWarning;
  do {
    do {
      bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&line,(bool *)0x0,-1);
      if (!bVar1) {
        cmXMLElement::~cmXMLElement(&e4);
        std::__cxx11::string::~string((string *)&line);
        std::ifstream::~ifstream(&fin);
        return;
      }
      this_00 = this;
      bVar1 = MatchesFilterPrefix(this,&line);
    } while (bVar1);
    bVar1 = Match(this_00,&line,&this->RegexWarningSuppress);
    if (bVar1) {
      std::operator+(&local_258,"[CTest: warning suppressed] ",&line);
LAB_00174385:
      std::__cxx11::string::operator=((string *)&line,(string *)&local_258);
      std::__cxx11::string::~string((string *)&local_258);
    }
    else {
      bVar1 = Match(this_00,&line,local_280);
      if (bVar1) {
        std::operator+(&local_258,"[CTest: warning matched] ",&line);
        goto LAB_00174385;
      }
    }
    cmXMLWriter::Content<char_const*>(e4.xmlwr,&sep);
    cmXMLWriter::Content<std::__cxx11::string>(e4.xmlwr,&line);
    sep = "\n";
  } while( true );
}

Assistant:

void cmCTestLaunch::DumpFileToXML(cmXMLElement& e3, const char* tag,
                                  std::string const& fname)
{
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);

  std::string line;
  const char* sep = "";

  cmXMLElement e4(e3, tag);
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (MatchesFilterPrefix(line)) {
      continue;
    }
    if (this->Match(line, this->RegexWarningSuppress)) {
      line = "[CTest: warning suppressed] " + line;
    } else if (this->Match(line, this->RegexWarning)) {
      line = "[CTest: warning matched] " + line;
    }
    e4.Content(sep);
    e4.Content(line);
    sep = "\n";
  }
}